

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_SwapWithOther_Test::TestBody
          (GeneratedMessageTest_SwapWithOther_Test *this)

{
  bool bVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  TestAllTypes_NestedMessage *pTVar4;
  char *pcVar5;
  string *psVar6;
  Cord *pCVar7;
  AssertHelper local_bb0;
  Message local_ba8;
  TestAllTypes_NestedEnum local_b9c;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar_29;
  Message local_b80;
  TestAllTypes_NestedEnum local_b74;
  undefined1 local_b70 [8];
  AssertionResult gtest_ar_28;
  Message local_b58;
  int local_b50 [2];
  undefined1 local_b48 [8];
  AssertionResult gtest_ar_27;
  Message local_b30;
  int32_t local_b28;
  int local_b24;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar_26;
  Message local_b08;
  int32_t local_b00;
  int local_afc;
  undefined1 local_af8 [8];
  AssertionResult gtest_ar_25;
  Message local_ae0;
  int local_ad8 [2];
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar_24;
  Message local_ab8;
  undefined1 local_ab0 [8];
  AssertionResult gtest_ar_23;
  Message local_a98;
  undefined1 local_a90 [8];
  AssertionResult gtest_ar_22;
  Message local_a78;
  int local_a70 [2];
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_21;
  Message local_a50;
  int32_t local_a48;
  int local_a44;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar_20;
  Message local_a28;
  int32_t local_a20;
  int local_a1c;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar_19;
  Message local_a00;
  int local_9f8 [2];
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar_18;
  Message local_9d8;
  string_view local_9d0;
  Cord local_9c0;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_17;
  Message local_998;
  TestAllTypes_NestedEnum local_98c;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_16;
  Message local_970;
  int32_t local_968;
  int local_964;
  undefined1 local_960 [8];
  AssertionResult gtest_ar_15;
  Message local_948;
  undefined1 local_940 [8];
  AssertionResult gtest_ar_14;
  Message local_928;
  int32_t local_920;
  int local_91c;
  undefined1 local_918 [8];
  AssertionResult gtest_ar_13;
  Message local_900;
  TestAllTypes_NestedEnum local_8f4;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_12;
  Message local_8d8;
  int local_8d0 [2];
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_11;
  Message local_8b0;
  int32_t local_8a8;
  int local_8a4;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_10;
  Message local_888;
  int local_880 [2];
  undefined1 local_878 [8];
  AssertionResult gtest_ar_9;
  Message local_860;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_8;
  Message local_840;
  int local_838 [2];
  undefined1 local_830 [8];
  AssertionResult gtest_ar_7;
  Message local_818;
  int32_t local_810;
  int local_80c;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_7f0;
  Message local_7e8;
  int local_7e0 [2];
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_5;
  Message local_7c0;
  string_view local_7b8;
  Cord local_7a8;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_4;
  Message local_780;
  TestAllTypes_NestedEnum local_774;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_3;
  Message local_758;
  int32_t local_750;
  int local_74c;
  undefined1 local_748 [8];
  AssertionResult gtest_ar_2;
  Message local_730;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_1;
  Message local_710;
  int32_t local_708;
  int local_704;
  undefined1 local_700 [8];
  AssertionResult gtest_ar;
  string_view local_6e0 [2];
  undefined1 local_6c0 [8];
  TestAllTypes message2;
  TestAllTypes message1;
  GeneratedMessageTest_SwapWithOther_Test *this_local;
  
  message1.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&message2.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_6c0);
  proto2_unittest::TestAllTypes::set_optional_int32
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),0x7b);
  puVar2 = protobuf::internal::HasBits<2>::operator[]
                     ((HasBits<2> *)&message1.super_Message.super_MessageLite._internal_metadata_,0)
  ;
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)((long)&message2.field_0 + 0x328));
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &message1.field_0._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase.arena_,"abc"
             ,pAVar3);
  pTVar4 = proto2_unittest::TestAllTypes::mutable_optional_nested_message
                     ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,1);
  proto2_unittest::TestAllTypes::set_optional_nested_enum
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),TestAllTypes_NestedEnum_FOO);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_6e0,"bytes cord");
  proto2_unittest::TestAllTypes::set_optional_bytes_cord
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),local_6e0[0]);
  proto2_unittest::TestAllTypes::add_repeated_int32
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),1);
  proto2_unittest::TestAllTypes::add_repeated_int32
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),2);
  proto2_unittest::TestAllTypes::add_repeated_string<char_const(&)[2]>
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),(char (*) [2])0x1ed15ba);
  proto2_unittest::TestAllTypes::add_repeated_string<char_const(&)[2]>
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),(char (*) [2])0x1ed1911);
  pTVar4 = proto2_unittest::TestAllTypes::add_repeated_nested_message
                     ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,7);
  pTVar4 = proto2_unittest::TestAllTypes::add_repeated_nested_message
                     ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,8);
  proto2_unittest::TestAllTypes::add_repeated_nested_enum
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),TestAllTypes_NestedEnum_FOO);
  proto2_unittest::TestAllTypes::add_repeated_nested_enum
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),TestAllTypes_NestedEnum_BAR);
  proto2_unittest::TestAllTypes::set_optional_int32((TestAllTypes *)local_6c0,0x1c8);
  puVar2 = protobuf::internal::HasBits<2>::operator[]
                     ((HasBits<2> *)&message2.super_Message.super_MessageLite._internal_metadata_,0)
  ;
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_6c0);
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &message2.field_0._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase.arena_,"def"
             ,pAVar3);
  pTVar4 = proto2_unittest::TestAllTypes::mutable_optional_nested_message((TestAllTypes *)local_6c0)
  ;
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,2);
  proto2_unittest::TestAllTypes::set_optional_nested_enum
            ((TestAllTypes *)local_6c0,TestAllTypes_NestedEnum_BAR);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"bytes cord");
  proto2_unittest::TestAllTypes::set_optional_bytes_cord
            ((TestAllTypes *)local_6c0,stack0xfffffffffffff910);
  proto2_unittest::TestAllTypes::add_repeated_int32((TestAllTypes *)local_6c0,3);
  proto2_unittest::TestAllTypes::add_repeated_string<char_const(&)[2]>
            ((TestAllTypes *)local_6c0,(char (*) [2])0x1e6581e);
  pTVar4 = proto2_unittest::TestAllTypes::add_repeated_nested_message((TestAllTypes *)local_6c0);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,9);
  proto2_unittest::TestAllTypes::add_repeated_nested_enum
            ((TestAllTypes *)local_6c0,TestAllTypes_NestedEnum_BAZ);
  proto2_unittest::TestAllTypes::Swap
            ((TestAllTypes *)((long)&message2.field_0 + 0x328),(TestAllTypes *)local_6c0);
  local_704 = 0x1c8;
  local_708 = proto2_unittest::TestAllTypes::optional_int32
                        ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_700,"456","message1.optional_int32()",&local_704,&local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1c6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_710);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  psVar6 = proto2_unittest::TestAllTypes::optional_string_abi_cxx11_
                     ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_728,"\"def\"","message1.optional_string()",(char (*) [4])0x1f31348,
             psVar6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_728);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1c7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_730);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  local_74c = 2;
  pTVar4 = proto2_unittest::TestAllTypes::optional_nested_message
                     ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  local_750 = proto2_unittest::TestAllTypes_NestedMessage::bb(pTVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_748,"2","message1.optional_nested_message().bb()",&local_74c,
             &local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1c8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  local_774 = proto2_unittest::TestAllTypes::optional_nested_enum
                        ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  testing::internal::EqHelper::
  Compare<proto2_unittest::TestAllTypes_NestedEnum,_proto2_unittest::TestAllTypes_NestedEnum,_nullptr>
            ((EqHelper *)local_770,"::proto2_unittest::TestAllTypes::BAR",
             "message1.optional_nested_enum()",&proto2_unittest::TestAllTypes::BAR,&local_774);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1c9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7b8,"bytes cord");
  absl::lts_20250127::Cord::Cord(&local_7a8,local_7b8);
  pCVar7 = proto2_unittest::TestAllTypes::optional_bytes_cord
                     ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  testing::internal::EqHelper::Compare<absl::lts_20250127::Cord,_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_798,"absl::Cord(\"bytes cord\")","message1.optional_bytes_cord()",
             &local_7a8,pCVar7);
  absl::lts_20250127::Cord::~Cord(&local_7a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1ca,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_7c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_7c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  local_7e0[1] = 1;
  local_7e0[0] = proto2_unittest::TestAllTypes::repeated_int32_size
                           ((TestAllTypes *)((long)&message2.field_0 + 0x328));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_7d8,"1","message1.repeated_int32_size()",local_7e0 + 1,local_7e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_7f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x1cb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_7f0,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper(&local_7f0);
    testing::Message::~Message(&local_7e8);
  }
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  if (gtest_ar_6.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_80c = 3;
    local_810 = proto2_unittest::TestAllTypes::repeated_int32
                          ((TestAllTypes *)((long)&message2.field_0 + 0x328),0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_808,"3","message1.repeated_int32(0)",&local_80c,&local_810);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
    if (!bVar1) {
      testing::Message::Message(&local_818);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1cc,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_818);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_818);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
    local_838[1] = 1;
    local_838[0] = proto2_unittest::TestAllTypes::repeated_string_size
                             ((TestAllTypes *)((long)&message2.field_0 + 0x328));
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_830,"1","message1.repeated_string_size()",local_838 + 1,local_838);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
    if (!bVar1) {
      testing::Message::Message(&local_840);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x1cd,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_840);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_840);
    }
    gtest_ar_6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
    if (gtest_ar_6.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      psVar6 = proto2_unittest::TestAllTypes::repeated_string_abi_cxx11_
                         ((TestAllTypes *)((long)&message2.field_0 + 0x328),0);
      testing::internal::EqHelper::
      Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_858,"\"c\"","message1.repeated_string(0)",(char (*) [2])0x1e6581e
                 ,psVar6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
      if (!bVar1) {
        testing::Message::Message(&local_860);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_858);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                   ,0x1ce,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_860);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
        testing::Message::~Message(&local_860);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
      local_880[1] = 1;
      local_880[0] = proto2_unittest::TestAllTypes::repeated_nested_message_size
                               ((TestAllTypes *)((long)&message2.field_0 + 0x328));
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_878,"1","message1.repeated_nested_message_size()",local_880 + 1,
                 local_880);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
      if (!bVar1) {
        testing::Message::Message(&local_888);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_878);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                   ,0x1cf,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_888)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
        testing::Message::~Message(&local_888);
      }
      gtest_ar_6.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_6.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
      if (gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_8a4 = 9;
        pTVar4 = proto2_unittest::TestAllTypes::repeated_nested_message
                           ((TestAllTypes *)((long)&message2.field_0 + 0x328),0);
        local_8a8 = proto2_unittest::TestAllTypes_NestedMessage::bb(pTVar4);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_8a0,"9","message1.repeated_nested_message(0).bb()",&local_8a4,
                   &local_8a8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
        if (!bVar1) {
          testing::Message::Message(&local_8b0);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8a0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                     ,0x1d0,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_11.message_,&local_8b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
          testing::Message::~Message(&local_8b0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
        local_8d0[1] = 1;
        local_8d0[0] = proto2_unittest::TestAllTypes::repeated_nested_enum_size
                                 ((TestAllTypes *)((long)&message2.field_0 + 0x328));
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_8c8,"1","message1.repeated_nested_enum_size()",local_8d0 + 1,
                   local_8d0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
        if (!bVar1) {
          testing::Message::Message(&local_8d8);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8c8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                     ,0x1d1,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_12.message_,&local_8d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
          testing::Message::~Message(&local_8d8);
        }
        gtest_ar_6.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_6.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
        if (gtest_ar_6.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_8f4 = proto2_unittest::TestAllTypes::repeated_nested_enum
                                ((TestAllTypes *)((long)&message2.field_0 + 0x328),0);
          testing::internal::EqHelper::
          Compare<proto2_unittest::TestAllTypes_NestedEnum,_proto2_unittest::TestAllTypes_NestedEnum,_nullptr>
                    ((EqHelper *)local_8f0,"::proto2_unittest::TestAllTypes::BAZ",
                     "message1.repeated_nested_enum(0)",&proto2_unittest::TestAllTypes::BAZ,
                     &local_8f4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
          if (!bVar1) {
            testing::Message::Message(&local_900);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                       ,0x1d2,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_13.message_,&local_900);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
            testing::Message::~Message(&local_900);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
          local_91c = 0x7b;
          local_920 = proto2_unittest::TestAllTypes::optional_int32((TestAllTypes *)local_6c0);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_918,"123","message2.optional_int32()",&local_91c,&local_920);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
          if (!bVar1) {
            testing::Message::Message(&local_928);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_918);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                       ,0x1d4,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_14.message_,&local_928);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
            testing::Message::~Message(&local_928);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
          psVar6 = proto2_unittest::TestAllTypes::optional_string_abi_cxx11_
                             ((TestAllTypes *)local_6c0);
          testing::internal::EqHelper::
          Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                    ((EqHelper *)local_940,"\"abc\"","message2.optional_string()",
                     (char (*) [4])"abc",psVar6);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
          if (!bVar1) {
            testing::Message::Message(&local_948);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_940);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                       ,0x1d5,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_15.message_,&local_948);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
            testing::Message::~Message(&local_948);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
          local_964 = 1;
          pTVar4 = proto2_unittest::TestAllTypes::optional_nested_message((TestAllTypes *)local_6c0)
          ;
          local_968 = proto2_unittest::TestAllTypes_NestedMessage::bb(pTVar4);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_960,"1","message2.optional_nested_message().bb()",&local_964,
                     &local_968);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_960);
          if (!bVar1) {
            testing::Message::Message(&local_970);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_960);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                       ,0x1d6,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_16.message_,&local_970);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
            testing::Message::~Message(&local_970);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_960);
          local_98c = proto2_unittest::TestAllTypes::optional_nested_enum((TestAllTypes *)local_6c0)
          ;
          testing::internal::EqHelper::
          Compare<proto2_unittest::TestAllTypes_NestedEnum,_proto2_unittest::TestAllTypes_NestedEnum,_nullptr>
                    ((EqHelper *)local_988,"::proto2_unittest::TestAllTypes::FOO",
                     "message2.optional_nested_enum()",&proto2_unittest::TestAllTypes::FOO,
                     &local_98c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
          if (!bVar1) {
            testing::Message::Message(&local_998);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                       ,0x1d7,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_17.message_,&local_998);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
            testing::Message::~Message(&local_998);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_9d0,"bytes cord");
          absl::lts_20250127::Cord::Cord(&local_9c0,local_9d0);
          pCVar7 = proto2_unittest::TestAllTypes::optional_bytes_cord((TestAllTypes *)local_6c0);
          testing::internal::EqHelper::
          Compare<absl::lts_20250127::Cord,_absl::lts_20250127::Cord,_nullptr>
                    ((EqHelper *)local_9b0,"absl::Cord(\"bytes cord\")",
                     "message2.optional_bytes_cord()",&local_9c0,pCVar7);
          absl::lts_20250127::Cord::~Cord(&local_9c0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
          if (!bVar1) {
            testing::Message::Message(&local_9d8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                       ,0x1d8,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_18.message_,&local_9d8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
            testing::Message::~Message(&local_9d8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
          local_9f8[1] = 2;
          local_9f8[0] = proto2_unittest::TestAllTypes::repeated_int32_size
                                   ((TestAllTypes *)local_6c0);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_9f0,"2","message2.repeated_int32_size()",local_9f8 + 1,
                     local_9f8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
          if (!bVar1) {
            testing::Message::Message(&local_a00);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9f0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_19.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                       ,0x1d9,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_19.message_,&local_a00);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
            testing::Message::~Message(&local_a00);
          }
          gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
          if (gtest_ar_6.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_a1c = 1;
            local_a20 = proto2_unittest::TestAllTypes::repeated_int32((TestAllTypes *)local_6c0,0);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_a18,"1","message2.repeated_int32(0)",&local_a1c,&local_a20)
            ;
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
            if (!bVar1) {
              testing::Message::Message(&local_a28);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a18);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                         ,0x1da,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_20.message_,&local_a28);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
              testing::Message::~Message(&local_a28);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
            local_a44 = 2;
            local_a48 = proto2_unittest::TestAllTypes::repeated_int32((TestAllTypes *)local_6c0,1);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_a40,"2","message2.repeated_int32(1)",&local_a44,&local_a48)
            ;
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
            if (!bVar1) {
              testing::Message::Message(&local_a50);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a40);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                         ,0x1db,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_21.message_,&local_a50);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
              testing::Message::~Message(&local_a50);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
            local_a70[1] = 2;
            local_a70[0] = proto2_unittest::TestAllTypes::repeated_string_size
                                     ((TestAllTypes *)local_6c0);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_a68,"2","message2.repeated_string_size()",local_a70 + 1,
                       local_a70);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
            if (!bVar1) {
              testing::Message::Message(&local_a78);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a68);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_22.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                         ,0x1dc,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_22.message_,&local_a78);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
              testing::Message::~Message(&local_a78);
            }
            gtest_ar_6.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_6.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
            if (gtest_ar_6.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              psVar6 = proto2_unittest::TestAllTypes::repeated_string_abi_cxx11_
                                 ((TestAllTypes *)local_6c0,0);
              testing::internal::EqHelper::
              Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                        ((EqHelper *)local_a90,"\"a\"","message2.repeated_string(0)",
                         (char (*) [2])0x1ed15ba,psVar6);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
              if (!bVar1) {
                testing::Message::Message(&local_a98);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a90);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                           ,0x1dd,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_23.message_,&local_a98);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_23.message_);
                testing::Message::~Message(&local_a98);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
              psVar6 = proto2_unittest::TestAllTypes::repeated_string_abi_cxx11_
                                 ((TestAllTypes *)local_6c0,1);
              testing::internal::EqHelper::
              Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                        ((EqHelper *)local_ab0,"\"b\"","message2.repeated_string(1)",
                         (char (*) [2])0x1ed1911,psVar6);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab0);
              if (!bVar1) {
                testing::Message::Message(&local_ab8);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_ab0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                           ,0x1de,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_24.message_,&local_ab8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_24.message_);
                testing::Message::~Message(&local_ab8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab0);
              local_ad8[1] = 2;
              local_ad8[0] = proto2_unittest::TestAllTypes::repeated_nested_message_size
                                       ((TestAllTypes *)local_6c0);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_ad0,"2","message2.repeated_nested_message_size()",
                         local_ad8 + 1,local_ad8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
              if (!bVar1) {
                testing::Message::Message(&local_ae0);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_ad0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_25.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                           ,0x1df,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_25.message_,&local_ae0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_25.message_);
                testing::Message::~Message(&local_ae0);
              }
              gtest_ar_6.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_6.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
              if (gtest_ar_6.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_afc = 7;
                pTVar4 = proto2_unittest::TestAllTypes::repeated_nested_message
                                   ((TestAllTypes *)local_6c0,0);
                local_b00 = proto2_unittest::TestAllTypes_NestedMessage::bb(pTVar4);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_af8,"7","message2.repeated_nested_message(0).bb()",
                           &local_afc,&local_b00);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_af8);
                if (!bVar1) {
                  testing::Message::Message(&local_b08);
                  pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_af8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                             ,0x1e0,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_26.message_,&local_b08);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_26.message_);
                  testing::Message::~Message(&local_b08);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_af8);
                local_b24 = 8;
                pTVar4 = proto2_unittest::TestAllTypes::repeated_nested_message
                                   ((TestAllTypes *)local_6c0,1);
                local_b28 = proto2_unittest::TestAllTypes_NestedMessage::bb(pTVar4);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_b20,"8","message2.repeated_nested_message(1).bb()",
                           &local_b24,&local_b28);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_b20);
                if (!bVar1) {
                  testing::Message::Message(&local_b30);
                  pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b20);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                             ,0x1e1,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_27.message_,&local_b30);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_27.message_);
                  testing::Message::~Message(&local_b30);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_b20);
                local_b50[1] = 2;
                local_b50[0] = proto2_unittest::TestAllTypes::repeated_nested_enum_size
                                         ((TestAllTypes *)local_6c0);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_b48,"2","message2.repeated_nested_enum_size()",
                           local_b50 + 1,local_b50);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_b48);
                if (!bVar1) {
                  testing::Message::Message(&local_b58);
                  pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b48);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_28.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                             ,0x1e2,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_28.message_,&local_b58);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_28.message_);
                  testing::Message::~Message(&local_b58);
                }
                gtest_ar_6.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_6.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
                if (gtest_ar_6.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_b74 = proto2_unittest::TestAllTypes::repeated_nested_enum
                                        ((TestAllTypes *)local_6c0,0);
                  testing::internal::EqHelper::
                  Compare<proto2_unittest::TestAllTypes_NestedEnum,_proto2_unittest::TestAllTypes_NestedEnum,_nullptr>
                            ((EqHelper *)local_b70,"::proto2_unittest::TestAllTypes::FOO",
                             "message2.repeated_nested_enum(0)",&proto2_unittest::TestAllTypes::FOO,
                             &local_b74);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_b70);
                  if (!bVar1) {
                    testing::Message::Message(&local_b80);
                    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b70)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                               ,0x1e3,pcVar5);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_29.message_,&local_b80);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_29.message_);
                    testing::Message::~Message(&local_b80);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b70);
                  local_b9c = proto2_unittest::TestAllTypes::repeated_nested_enum
                                        ((TestAllTypes *)local_6c0,1);
                  testing::internal::EqHelper::
                  Compare<proto2_unittest::TestAllTypes_NestedEnum,_proto2_unittest::TestAllTypes_NestedEnum,_nullptr>
                            ((EqHelper *)local_b98,"::proto2_unittest::TestAllTypes::BAR",
                             "message2.repeated_nested_enum(1)",&proto2_unittest::TestAllTypes::BAR,
                             &local_b9c);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_b98);
                  if (!bVar1) {
                    testing::Message::Message(&local_ba8);
                    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b98)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_bb0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                               ,0x1e4,pcVar5);
                    testing::internal::AssertHelper::operator=(&local_bb0,&local_ba8);
                    testing::internal::AssertHelper::~AssertHelper(&local_bb0);
                    testing::Message::~Message(&local_ba8);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
                  gtest_ar_6.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_6c0);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&message2.field_0 + 0x328));
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, SwapWithOther) {
  UNITTEST::TestAllTypes message1, message2;

  message1.set_optional_int32(123);
  message1.set_optional_string("abc");
  message1.mutable_optional_nested_message()->set_bb(1);
  message1.set_optional_nested_enum(UNITTEST::TestAllTypes::FOO);
  message1.set_optional_bytes_cord("bytes cord");
  message1.add_repeated_int32(1);
  message1.add_repeated_int32(2);
  message1.add_repeated_string("a");
  message1.add_repeated_string("b");
  message1.add_repeated_nested_message()->set_bb(7);
  message1.add_repeated_nested_message()->set_bb(8);
  message1.add_repeated_nested_enum(UNITTEST::TestAllTypes::FOO);
  message1.add_repeated_nested_enum(UNITTEST::TestAllTypes::BAR);

  message2.set_optional_int32(456);
  message2.set_optional_string("def");
  message2.mutable_optional_nested_message()->set_bb(2);
  message2.set_optional_nested_enum(UNITTEST::TestAllTypes::BAR);
  message2.set_optional_bytes_cord("bytes cord");
  message2.add_repeated_int32(3);
  message2.add_repeated_string("c");
  message2.add_repeated_nested_message()->set_bb(9);
  message2.add_repeated_nested_enum(UNITTEST::TestAllTypes::BAZ);

  message1.Swap(&message2);

  EXPECT_EQ(456, message1.optional_int32());
  EXPECT_EQ("def", message1.optional_string());
  EXPECT_EQ(2, message1.optional_nested_message().bb());
  EXPECT_EQ(UNITTEST::TestAllTypes::BAR, message1.optional_nested_enum());
  EXPECT_EQ(absl::Cord("bytes cord"), message1.optional_bytes_cord());
  ASSERT_EQ(1, message1.repeated_int32_size());
  EXPECT_EQ(3, message1.repeated_int32(0));
  ASSERT_EQ(1, message1.repeated_string_size());
  EXPECT_EQ("c", message1.repeated_string(0));
  ASSERT_EQ(1, message1.repeated_nested_message_size());
  EXPECT_EQ(9, message1.repeated_nested_message(0).bb());
  ASSERT_EQ(1, message1.repeated_nested_enum_size());
  EXPECT_EQ(UNITTEST::TestAllTypes::BAZ, message1.repeated_nested_enum(0));

  EXPECT_EQ(123, message2.optional_int32());
  EXPECT_EQ("abc", message2.optional_string());
  EXPECT_EQ(1, message2.optional_nested_message().bb());
  EXPECT_EQ(UNITTEST::TestAllTypes::FOO, message2.optional_nested_enum());
  EXPECT_EQ(absl::Cord("bytes cord"), message2.optional_bytes_cord());
  ASSERT_EQ(2, message2.repeated_int32_size());
  EXPECT_EQ(1, message2.repeated_int32(0));
  EXPECT_EQ(2, message2.repeated_int32(1));
  ASSERT_EQ(2, message2.repeated_string_size());
  EXPECT_EQ("a", message2.repeated_string(0));
  EXPECT_EQ("b", message2.repeated_string(1));
  ASSERT_EQ(2, message2.repeated_nested_message_size());
  EXPECT_EQ(7, message2.repeated_nested_message(0).bb());
  EXPECT_EQ(8, message2.repeated_nested_message(1).bb());
  ASSERT_EQ(2, message2.repeated_nested_enum_size());
  EXPECT_EQ(UNITTEST::TestAllTypes::FOO, message2.repeated_nested_enum(0));
  EXPECT_EQ(UNITTEST::TestAllTypes::BAR, message2.repeated_nested_enum(1));
}